

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

uint8_t duckdb::StringUtil::GetHexValue(char c)

{
  undefined8 uVar1;
  char in_DIL;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  InvalidInputException *in_stack_fffffffffffffff0;
  uchar local_1;
  
  if ((in_DIL < '0') || ('9' < in_DIL)) {
    if ((in_DIL < 'a') || ('f' < in_DIL)) {
      if ((in_DIL < 'A') || ('F' < in_DIL)) {
        uVar1 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_28,"Invalid input for hex digit: %s",&local_29);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_60,1,in_DIL,&local_61);
        InvalidInputException::
        InvalidInputException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
        __cxa_throw(uVar1,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      local_1 = UnsafeNumericCast<unsigned_char,_int,_void>(in_DIL + -0x37);
    }
    else {
      local_1 = UnsafeNumericCast<unsigned_char,_int,_void>(in_DIL + -0x57);
    }
  }
  else {
    local_1 = UnsafeNumericCast<unsigned_char,_int,_void>(in_DIL + -0x30);
  }
  return local_1;
}

Assistant:

static uint8_t GetHexValue(char c) {
		if (c >= '0' && c <= '9') {
			return UnsafeNumericCast<uint8_t>(c - '0');
		}
		if (c >= 'a' && c <= 'f') {
			return UnsafeNumericCast<uint8_t>(c - 'a' + 10);
		}
		if (c >= 'A' && c <= 'F') {
			return UnsafeNumericCast<uint8_t>(c - 'A' + 10);
		}
		throw InvalidInputException("Invalid input for hex digit: %s", string(1, c));
	}